

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall fasttext::Model::buildTree(Model *this,vector<long,_std::allocator<long>_> *counts)

{
  int iVar1;
  reference pvVar2;
  const_reference pvVar3;
  vector<long,_std::allocator<long>_> *in_RSI;
  long in_RDI;
  int32_t j_1;
  vector<bool,_std::allocator<bool>_> code;
  vector<int,_std::allocator<int>_> path;
  int32_t i_3;
  int32_t j;
  int32_t mini [2];
  int32_t i_2;
  int32_t node;
  int32_t leaf;
  int32_t i_1;
  int32_t i;
  int32_t in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff3c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  size_type in_stack_ffffffffffffff58;
  int64_t iVar4;
  vector<fasttext::Node,_std::allocator<fasttext::Node>_> *in_stack_ffffffffffffff60;
  value_type vVar5;
  int local_7c;
  undefined1 in_stack_ffffffffffffff9f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffa0;
  int local_34;
  int local_30;
  int32_t local_2c [2];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  vector<long,_std::allocator<long>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0xac) * 2 + -1; local_14 = local_14 + 1) {
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_14);
    pvVar2->parent = -1;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_14);
    pvVar2->left = -1;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_14);
    pvVar2->right = -1;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_14);
    pvVar2->count = 1000000000000000;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_14);
    pvVar2->binary = false;
  }
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0xac); local_18 = local_18 + 1) {
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](local_10,(long)local_18);
    vVar5 = *pvVar3;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_18);
    pvVar2->count = vVar5;
  }
  local_1c = *(int *)(in_RDI + 0xac) + -1;
  local_20 = *(int *)(in_RDI + 0xac);
  local_24 = *(int *)(in_RDI + 0xac);
  do {
    if (*(int *)(in_RDI + 0xac) * 2 + -1 <= local_24) {
      for (local_34 = 0; local_34 < *(int *)(in_RDI + 0xac); local_34 = local_34 + 1) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x17bc33);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)0x17bc3d);
        local_7c = local_34;
        while( true ) {
          pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                             ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                              (in_RDI + 0x140),(long)local_7c);
          if (pvVar2->parent == -1) break;
          std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                    ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                     (long)local_7c);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffff40,
                     (value_type_conflict *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                    ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                     (long)local_7c);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
          pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                             ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                              (in_RDI + 0x140),(long)local_7c);
          local_7c = pvVar2->parent;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    (value_type *)in_stack_ffffffffffffff48);
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::push_back((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff48);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x17bd49);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      return;
    }
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      if (local_1c < 0) {
LAB_0017ba83:
        iVar1 = local_20 + 1;
        local_2c[local_30] = local_20;
        local_20 = iVar1;
      }
      else {
        pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                           ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                            (in_RDI + 0x140),(long)local_1c);
        iVar4 = pvVar2->count;
        pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                           ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                            (in_RDI + 0x140),(long)local_20);
        if (pvVar2->count <= iVar4) goto LAB_0017ba83;
        iVar1 = local_1c + -1;
        local_2c[local_30] = local_1c;
        local_1c = iVar1;
      }
    }
    in_stack_ffffffffffffff38 = local_2c[0];
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_24);
    pvVar2->left = in_stack_ffffffffffffff38;
    in_stack_ffffffffffffff3c = local_2c[1];
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_24);
    pvVar2->right = in_stack_ffffffffffffff3c;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_2c[0]);
    in_stack_ffffffffffffff40 = (vector<int,_std::allocator<int>_> *)pvVar2->count;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_2c[1]);
    in_stack_ffffffffffffff48 =
         (value_type *)
         ((long)&(in_stack_ffffffffffffff40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + pvVar2->count);
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_24);
    pvVar2->count = (int64_t)in_stack_ffffffffffffff48;
    in_stack_ffffffffffffff50 = local_24;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_2c[0]);
    pvVar2->parent = in_stack_ffffffffffffff50;
    in_stack_ffffffffffffff54 = local_24;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_2c[1]);
    pvVar2->parent = in_stack_ffffffffffffff54;
    pvVar2 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)(in_RDI + 0x140),
                        (long)local_2c[1]);
    pvVar2->binary = true;
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Model::buildTree(const std::vector<int64_t>& counts) {
	tree.resize(2 * osz_ - 1);
	for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
		tree[i].parent = -1;
		tree[i].left = -1;
		tree[i].right = -1;
		tree[i].count = 1e15;
		tree[i].binary = false;
	}
	for (int32_t i = 0; i < osz_; i++) {
		tree[i].count = counts[i];
	}
	int32_t leaf = osz_ - 1;
	int32_t node = osz_;
	for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
		int32_t mini[2];
		for (int32_t j = 0; j < 2; j++) {
			if (leaf >= 0 && tree[leaf].count < tree[node].count) {
				mini[j] = leaf--;
			} else {
				mini[j] = node++;
			}
		}
		tree[i].left = mini[0];
		tree[i].right = mini[1];
		tree[i].count = tree[mini[0]].count + tree[mini[1]].count;
		tree[mini[0]].parent = i;
		tree[mini[1]].parent = i;
		tree[mini[1]].binary = true;
	}
	for (int32_t i = 0; i < osz_; i++) {
		std::vector<int32_t> path;
		std::vector<bool> code;
		int32_t j = i;
		while (tree[j].parent != -1) {
			path.push_back(tree[j].parent - osz_);
			code.push_back(tree[j].binary);
			j = tree[j].parent;
		}
		paths.push_back(path);
		codes.push_back(code);
	}
}